

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlSaveWriteIndent(xmlSaveCtxtPtr ctxt,int extra)

{
  int *piVar1;
  int local_18;
  int level;
  int extra_local;
  xmlSaveCtxtPtr ctxt_local;
  
  if (((ctxt->options & 0x200U) == 0) &&
     (((ctxt->options & 0x400U) != 0 || (piVar1 = __xmlIndentTreeOutput(), *piVar1 != 0)))) {
    local_18 = ctxt->level + extra;
    if (ctxt->indent_nr < local_18) {
      local_18 = ctxt->indent_nr;
    }
    xmlOutputBufferWrite(ctxt->buf,ctxt->indent_size * local_18,ctxt->indent);
  }
  return;
}

Assistant:

static void
xmlSaveWriteIndent(xmlSaveCtxtPtr ctxt, int extra)
{
    int level;

    if ((ctxt->options & XML_SAVE_NO_INDENT) ||
        (((ctxt->options & XML_SAVE_INDENT) == 0) &&
         (xmlIndentTreeOutput == 0)))
        return;

    level = ctxt->level + extra;
    if (level > ctxt->indent_nr)
        level = ctxt->indent_nr;
    xmlOutputBufferWrite(ctxt->buf, ctxt->indent_size * level, ctxt->indent);
}